

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O3

void __thiscall IMLE::update(IMLE *this,Z *z,X *x)

{
  int iVar1;
  pointer this_00;
  Scal SVar2;
  double dVar3;
  FastLinearExpert local_330;
  
  if (((z->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows !=
       (long)this->d) ||
     ((x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows !=
      (long)this->D)) {
    local_330.super_LinearExpert._0_8_ = (Index **)((long)&local_330 + 0x10U);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_330,"IMLE::update: sample point dimensions do not match!!","");
    message(this,(string *)&local_330);
    if ((Index **)local_330.super_LinearExpert._0_8_ == (Index **)((long)&local_330 + 0x10U)) {
      return;
    }
    operator_delete((void *)local_330.super_LinearExpert._0_8_);
    return;
  }
  dVar3 = 0.0;
  for (this_00 = (this->experts).
                 super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                 .
                 super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      this_00 < (this->experts).
                super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                .
                super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                ._M_impl.super__Vector_impl_data._M_finish; this_00 = this_00 + 1) {
    SVar2 = LinearExpert::queryZXandH(&this_00->super_LinearExpert,z,x);
    dVar3 = dVar3 + SVar2;
  }
  if ((this->M == 0) || (dVar3 < this->pNoiseModelZX / (double)this->M)) {
    if (0 < this->noise_to_go) {
      iVar1 = this->noise_to_go + -1;
      goto LAB_0014608f;
    }
    FastLinearExpert::FastLinearExpert(&local_330,this->d,this->D,z,x,this);
    std::vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>::
    push_back(&(this->experts).
               super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
              ,&local_330);
    free(local_330.invSzz0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
         m_storage.m_data);
    free(local_330.invSzz.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
         .m_data);
    LinearExpert::~LinearExpert(&local_330.super_LinearExpert);
    LinearExpert::queryH
              (&(this->experts).
                super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                .
                super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1].super_LinearExpert,z,x);
    this->M = (int)((ulong)((long)(this->experts).
                                  super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                                  .
                                  super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->experts).
                                 super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                                 .
                                 super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x5f02a3a1;
  }
  EM(this,z,x);
  iVar1 = (this->param).nOutliers;
LAB_0014608f:
  this->noise_to_go = iVar1;
  return;
}

Assistant:

IMLE_CLASS_TEMPLATE
void IMLE_base::update(Z const &z, X const &x)
{
#ifdef IMLE_NO_TEMPLATES
    // Check dimensions
    if( z.size() != d || x.size() != D)
    {
        message("IMLE::update: sample point dimensions do not match!!");
        return;
    }
#endif

    // Query experts
    Scal sum_zx = 0.0;
    for(IMLE_TYPENAME Experts::iterator it=experts.begin(); it < experts.end(); it++)
        sum_zx += it->queryZXandH(z,x);

    // Create new expert?
    if( sum_zx < pNoiseModelZX / M || M == 0 )
	{
	    if( noise_to_go > 0)
	    {
	        noise_to_go--;
            return;
	    }

        // Create new linear expert
#ifdef IMLE_NO_TEMPLATES
        experts.push_back( Expert(d,D,z,x,this) );
#else
        experts.push_back( Expert(z,x,this) );
#endif
        experts.back().queryH(z,x);
        M = experts.size();
	}

    EM(z,x);

	noise_to_go = param.nOutliers;
}